

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

int32 feat_s2mfc2feat_block_utt(feat_t *fcb,mfcc_t **uttcep,int32 nfr,mfcc_t ***ofeat)

{
  int win_00;
  int iVar1;
  mfcc_t **mfc;
  int32 cepsize;
  int32 win;
  int32 i;
  mfcc_t **cepbuf;
  mfcc_t ***ofeat_local;
  int32 nfr_local;
  mfcc_t **uttcep_local;
  feat_t *fcb_local;
  
  win_00 = fcb->window_size;
  iVar1 = fcb->cepsize;
  mfc = (mfcc_t **)
        __ckd_calloc__((long)(nfr + win_00 * 2),8,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                       ,0x507);
  memcpy(mfc + win_00,uttcep,(long)nfr << 3);
  feat_cmn(fcb,mfc + win_00,nfr,1,1);
  feat_agc(fcb,mfc + win_00,nfr,1,1);
  for (cepsize = 0; cepsize < win_00; cepsize = cepsize + 1) {
    mfc[cepsize] = fcb->cepbuf[cepsize];
    memcpy(mfc[cepsize],*uttcep,(long)iVar1 << 2);
    mfc[nfr + win_00 + cepsize] = fcb->cepbuf[win_00 + cepsize];
    memcpy(mfc[nfr + win_00 + cepsize],uttcep[nfr + -1],(long)iVar1 << 2);
  }
  feat_compute_utt(fcb,mfc,nfr + win_00 * 2,win_00,ofeat);
  ckd_free(mfc);
  return nfr;
}

Assistant:

static int32
feat_s2mfc2feat_block_utt(feat_t * fcb, mfcc_t ** uttcep,
			  int32 nfr, mfcc_t *** ofeat)
{
    mfcc_t **cepbuf;
    int32 i, win, cepsize;

    win = feat_window_size(fcb);
    cepsize = feat_cepsize(fcb);

    /* Copy and pad out the utterance (this requires that the
     * feature computation functions always access the buffer via
     * the frame pointers, which they do)  */
    cepbuf = (mfcc_t **)ckd_calloc(nfr + win * 2, sizeof(mfcc_t *));
    memcpy(cepbuf + win, uttcep, nfr * sizeof(mfcc_t *));

    /* Do normalization before we interpolate on the boundary */    
    feat_cmn(fcb, cepbuf + win, nfr, 1, 1);
    feat_agc(fcb, cepbuf + win, nfr, 1, 1);

    /* Now interpolate */    
    for (i = 0; i < win; ++i) {
        cepbuf[i] = fcb->cepbuf[i];
        memcpy(cepbuf[i], uttcep[0], cepsize * sizeof(mfcc_t));
        cepbuf[nfr + win + i] = fcb->cepbuf[win + i];
        memcpy(cepbuf[nfr + win + i], uttcep[nfr - 1], cepsize * sizeof(mfcc_t));
    }
    /* Compute as usual. */
    feat_compute_utt(fcb, cepbuf, nfr + win * 2, win, ofeat);
    ckd_free(cepbuf);
    return nfr;
}